

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::DOMAttrImpl::getValue(DOMAttrImpl *this)

{
  DOMNode *pDVar1;
  DOMDocument *pDVar2;
  int iVar3;
  DOMChildNode *pDVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar5;
  DOMDocumentImpl *this_00;
  DOMNode **ppDVar6;
  XMLBuffer buf;
  XMLBuffer local_58;
  
  pDVar1 = (this->fParent).fFirstChild;
  if (pDVar1 == (DOMNode *)0x0) {
    pXVar5 = L"";
  }
  else {
    ppDVar6 = &(this->fParent).fFirstChild;
    pDVar4 = castToChildImpl(pDVar1);
    if (pDVar4->nextSibling == (DOMNode *)0x0) {
      iVar3 = (*(*ppDVar6)->_vptr_DOMNode[4])();
      if (iVar3 == 3) {
        iVar3 = (*(*ppDVar6)->_vptr_DOMNode[3])();
        return (XMLCh *)CONCAT44(extraout_var,iVar3);
      }
    }
    pDVar2 = (this->fParent).fOwnerDocument;
    this_00 = (DOMDocumentImpl *)&pDVar2[-1].super_DOMNode;
    if (pDVar2 == (DOMDocument *)0x0) {
      this_00 = (DOMDocumentImpl *)0x0;
    }
    local_58.fMemoryManager = this_00->fMemoryManager;
    local_58.fIndex = 0;
    local_58.fCapacity = 0x3ff;
    local_58.fFullSize = 0;
    local_58.fUsed = false;
    local_58.fFullHandler = (XMLBufferFullHandler *)0x0;
    iVar3 = (*(local_58.fMemoryManager)->_vptr_MemoryManager[3])(local_58.fMemoryManager,0x800);
    local_58.fBuffer = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
    *local_58.fBuffer = L'\0';
    while (pDVar1 = *ppDVar6, pDVar1 != (DOMNode *)0x0) {
      getTextValue(this,pDVar1,&local_58);
      pDVar4 = castToChildImpl(pDVar1);
      ppDVar6 = &pDVar4->nextSibling;
    }
    local_58.fBuffer[local_58.fIndex] = L'\0';
    pXVar5 = DOMDocumentImpl::getPooledString(this_00,local_58.fBuffer);
    XMLBuffer::~XMLBuffer(&local_58);
  }
  return pXVar5;
}

Assistant:

const XMLCh * DOMAttrImpl::getValue() const
{
    if (fParent.fFirstChild == 0) {
        return XMLUni::fgZeroLenString; // return "";
    }

    // Simple case where attribute value is just a single text node
    DOMNode *node = castToChildImpl(fParent.fFirstChild)->nextSibling;
    if (node == 0 && fParent.fFirstChild->getNodeType() == DOMNode::TEXT_NODE) {
        return fParent.fFirstChild->getNodeValue();
    }

    //
    // Complicated case where attribute value is a DOM tree
    //
    // According to the spec, the child nodes of the Attr node may be either
    // Text or EntityReference nodes.
    //
    // The parser will not create such thing, this is for those created by users.
    //
    // In such case, we have to visit each child to retrieve the text
    //

    DOMDocumentImpl* doc = (DOMDocumentImpl*)fParent.fOwnerDocument;

    XMLBuffer buf(1023, doc->getMemoryManager());
    for (node = fParent.fFirstChild; node != 0; node = castToChildImpl(node)->nextSibling)
        getTextValue(node, buf);

    return doc->getPooledString(buf.getRawBuffer());
}